

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolverPSOR.cpp
# Opt level: O2

double __thiscall chrono::ChSolverPSOR::Solve(ChSolverPSOR *this,ChSystemDescriptor *sysd)

{
  int *piVar1;
  pointer ppCVar2;
  ChConstraint *pCVar3;
  pointer ppCVar4;
  ChVariables *this_00;
  pointer ppCVar5;
  ChConstraint *pCVar6;
  ChConstraint *pCVar7;
  undefined8 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  uint uVar15;
  ulong uVar16;
  int iter;
  int iVar17;
  uint uVar18;
  uint uVar19;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  double dVar23;
  double dVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [64];
  double dVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  double local_110;
  undefined1 local_108 [16];
  double gi_values [3];
  double old_lambda_friction [3];
  ChVectorRef local_88;
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> local_70 [24];
  void *local_58;
  ChVectorRef local_48;
  ulong uVar20;
  
  (this->super_ChIterativeSolverVI).m_iterations = 0;
  this->maxviolation = 0.0;
  uVar15 = 0;
  while( true ) {
    ppCVar2 = (sysd->vconstraints).
              super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    uVar16 = (long)(sysd->vconstraints).
                   super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar2 >> 3;
    if (uVar16 <= uVar15) break;
    (*ppCVar2[uVar15]->_vptr_ChConstraint[6])();
    uVar15 = uVar15 + 1;
  }
  iVar17 = 0;
  uVar15 = 0xffffffff;
  while( true ) {
    uVar19 = uVar15;
    uVar15 = uVar19 + 1;
    if (uVar16 <= uVar15) break;
    pCVar3 = ppCVar2[uVar15];
    if (pCVar3->mode == CONSTRAINT_FRIC) {
      gi_values[iVar17] = pCVar3->g_i;
      iVar17 = iVar17 + 1;
      if (iVar17 == 3) {
        dVar30 = (gi_values[0] + gi_values[1] + gi_values[2]) / 3.0;
        ppCVar2[uVar19 - 1]->g_i = dVar30;
        iVar17 = 0;
        ppCVar2[uVar19]->g_i = dVar30;
        pCVar3->g_i = dVar30;
      }
    }
  }
  uVar15 = 0;
  while( true ) {
    ppCVar4 = (sysd->vvariables).
              super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    uVar16 = (ulong)uVar15;
    if ((ulong)((long)(sysd->vvariables).
                      super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar4 >> 3) <= uVar16)
    break;
    this_00 = ppCVar4[uVar16];
    if (this_00->disabled == false) {
      ChVariables::Get_qb(&local_88,this_00);
      ChVariables::Get_fb(&local_48,
                          (sysd->vvariables).
                          super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar16]);
      Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
      Ref<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>>
                (local_70,&local_48.
                           super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                );
      (*this_00->_vptr_ChVariables[4])(this_00,&local_88,local_70);
      Eigen::internal::handmade_aligned_free(local_58);
    }
    uVar15 = uVar15 + 1;
  }
  if ((this->super_ChIterativeSolverVI).super_ChIterativeSolver.m_warm_start == true) {
    uVar15 = 0;
    while( true ) {
      ppCVar2 = (sysd->vconstraints).
                super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(sysd->vconstraints).
                        super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar2 >> 3) <=
          (ulong)uVar15) break;
      pCVar3 = ppCVar2[uVar15];
      if (pCVar3->active == true) {
        (*pCVar3->_vptr_ChConstraint[8])(pCVar3->l_i);
      }
      uVar15 = uVar15 + 1;
    }
  }
  else {
    ppCVar2 = (sysd->vconstraints).
              super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppCVar5 = (sysd->vconstraints).
              super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (uVar15 = 0; (ulong)uVar15 < (ulong)((long)ppCVar5 - (long)ppCVar2 >> 3);
        uVar15 = uVar15 + 1) {
      ppCVar2[uVar15]->l_i = 0.0;
    }
  }
  uVar15 = 0;
  do {
    if ((this->super_ChIterativeSolverVI).super_ChIterativeSolver.m_max_iterations <= (int)uVar15) {
      return this->maxviolation;
    }
    this->maxviolation = 0.0;
    auVar29 = ZEXT864(0) << 0x40;
    iVar17 = 0;
    uVar16 = 0xffffffff;
    local_110 = 0.0;
    while( true ) {
      ppCVar2 = (sysd->vconstraints).
                super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar19 = (int)uVar16 + 1;
      uVar20 = (ulong)uVar19;
      dVar30 = auVar29._0_8_;
      if ((ulong)((long)(sysd->vconstraints).
                        super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar2 >> 3) <= uVar20)
      break;
      pCVar3 = ppCVar2[uVar20];
      if (pCVar3->active == true) {
        (*pCVar3->_vptr_ChConstraint[7])();
        pCVar3 = (sysd->vconstraints).
                 super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar20];
        auVar25._8_8_ = 0;
        auVar25._0_8_ = pCVar3->cfm_i;
        auVar22._8_8_ = 0;
        auVar22._0_8_ = pCVar3->l_i;
        auVar31._8_8_ = 0;
        auVar31._0_8_ = dVar30 + pCVar3->b_i;
        auVar22 = vfmadd132sd_fma(auVar25,auVar31,auVar22);
        auVar25 = auVar22;
        (*pCVar3->_vptr_ChConstraint[0xc])();
        ppCVar2 = (sysd->vconstraints).
                  super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pCVar3 = ppCVar2[uVar20];
        auVar21._8_8_ = 0x8000000000000000;
        auVar21._0_8_ = 0x8000000000000000;
        auVar21 = vxorpd_avx512vl(auVar22,auVar21);
        dVar30 = pCVar3->l_i;
        dVar23 = ((this->super_ChIterativeSolverVI).m_omega / pCVar3->g_i) * auVar21._0_8_ + dVar30;
        if (pCVar3->mode == CONSTRAINT_FRIC) {
          old_lambda_friction[iVar17] = dVar30;
          pCVar3->l_i = dVar23;
          if (iVar17 == 0) {
            auVar9._8_8_ = 0x7fffffffffffffff;
            auVar9._0_8_ = 0x7fffffffffffffff;
            auVar21 = vandpd_avx512vl(auVar22,auVar9);
            uVar8 = vcmpsd_avx512f(ZEXT816(0) << 0x40,auVar22,1);
            auVar34._8_8_ = auVar21._8_8_;
            auVar34._0_8_ = (ulong)!(bool)((byte)uVar8 & 1) * auVar21._0_8_;
            iVar17 = 1;
          }
          else {
            iVar17 = iVar17 + 1;
            auVar34 = ZEXT816(0);
            if (iVar17 == 3) {
              uVar18 = (int)uVar16 - 1;
              (*ppCVar2[uVar18]->_vptr_ChConstraint[0xb])();
              ppCVar2 = (sysd->vconstraints).
                        super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              dVar30 = (this->super_ChIterativeSolverVI).m_shlambda;
              auVar40._8_8_ = 0;
              auVar40._0_8_ = dVar30;
              pCVar3 = ppCVar2[uVar18];
              pCVar6 = ppCVar2[uVar16];
              pCVar7 = ppCVar2[uVar20];
              dVar23 = pCVar3->l_i;
              auVar26._8_8_ = 0;
              auVar26._0_8_ = dVar23;
              dVar24 = pCVar6->l_i;
              auVar32._8_8_ = 0;
              auVar32._0_8_ = dVar24;
              local_108._0_8_ = pCVar7->l_i;
              auVar38._8_8_ = 0;
              auVar38._0_8_ = local_108._0_8_;
              if ((dVar30 != 1.0) || (NAN(dVar30))) {
                dVar30 = 1.0 - dVar30;
                auVar42._8_8_ = 0;
                auVar42._0_8_ = dVar30 * old_lambda_friction[0];
                auVar22 = vfmadd213sd_fma(auVar26,auVar40,auVar42);
                auVar43._8_8_ = 0;
                auVar43._0_8_ = dVar30 * old_lambda_friction[1];
                auVar21 = vfmadd213sd_fma(auVar32,auVar40,auVar43);
                dVar24 = auVar21._0_8_;
                auVar41._8_8_ = 0;
                auVar41._0_8_ = dVar30 * old_lambda_friction[2];
                auVar21 = vfmadd213sd_fma(auVar38,auVar40,auVar41);
                dVar23 = auVar22._0_8_;
                pCVar3->l_i = dVar23;
                pCVar6->l_i = dVar24;
                local_108._0_8_ = auVar21._0_8_;
                pCVar7->l_i = (double)local_108._0_8_;
              }
              dVar24 = dVar24 - old_lambda_friction[1];
              dVar23 = dVar23 - old_lambda_friction[0];
              local_108._0_8_ = (double)local_108._0_8_ - old_lambda_friction[2];
              local_108._8_8_ = 0;
              (*pCVar3->_vptr_ChConstraint[8])();
              (*(sysd->vconstraints).
                super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar16]->_vptr_ChConstraint[8])(dVar24);
              (*(sysd->vconstraints).
                super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar20]->_vptr_ChConstraint[8])
                        (local_108._0_8_);
              iVar17 = 0;
              if ((this->super_ChIterativeSolverVI).record_violation_history == true) {
                auVar13._8_8_ = 0x7fffffffffffffff;
                auVar13._0_8_ = 0x7fffffffffffffff;
                auVar33._8_8_ = 0;
                auVar33._0_8_ = local_110;
                auVar14._8_8_ = 0;
                auVar14._0_8_ = dVar23;
                auVar22 = vandpd_avx(auVar13,auVar14);
                auVar21 = vmaxsd_avx(auVar33,auVar22);
                auVar11._8_8_ = 0;
                auVar11._0_8_ = dVar24;
                auVar22 = vandpd_avx(auVar13,auVar11);
                auVar21 = vmaxsd_avx(auVar21,auVar22);
                auVar22 = vandpd_avx(auVar13,local_108);
                auVar22 = vmaxsd_avx(auVar21,auVar22);
                local_110 = auVar22._0_8_;
              }
              auVar34 = SUB6416(ZEXT864(0),0) << 0x40;
            }
          }
        }
        else {
          pCVar3->l_i = dVar23;
          (*pCVar3->_vptr_ChConstraint[0xb])();
          dVar23 = (this->super_ChIterativeSolverVI).m_shlambda;
          auVar35._8_8_ = 0;
          auVar35._0_8_ = dVar23;
          pCVar3 = (sysd->vconstraints).
                   super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar20];
          dVar24 = pCVar3->l_i;
          auVar27._8_8_ = 0;
          auVar27._0_8_ = dVar24;
          if ((dVar23 != 1.0) || (NAN(dVar23))) {
            auVar39._8_8_ = 0;
            auVar39._0_8_ = dVar30 * (1.0 - dVar23);
            auVar22 = vfmadd213sd_fma(auVar27,auVar35,auVar39);
            dVar24 = auVar22._0_8_;
            pCVar3->l_i = dVar24;
          }
          auVar36._8_8_ = 0x7fffffffffffffff;
          auVar36._0_8_ = 0x7fffffffffffffff;
          auVar34 = vandpd_avx(auVar36,auVar25);
          (*pCVar3->_vptr_ChConstraint[8])();
          if ((this->super_ChIterativeSolverVI).record_violation_history == true) {
            auVar12._8_8_ = 0;
            auVar12._0_8_ = dVar24 - dVar30;
            auVar37._8_8_ = 0;
            auVar37._0_8_ = local_110;
            auVar10._8_8_ = 0x7fffffffffffffff;
            auVar10._0_8_ = 0x7fffffffffffffff;
            auVar22 = vandpd_avx512vl(auVar12,auVar10);
            auVar22 = vmaxsd_avx(auVar37,auVar22);
            local_110 = auVar22._0_8_;
          }
        }
        auVar28._8_8_ = 0;
        auVar28._0_8_ = this->maxviolation;
        auVar22 = vmaxsd_avx(auVar28,auVar34);
        auVar29 = ZEXT1664(auVar22);
        this->maxviolation = auVar22._0_8_;
      }
      uVar16 = (ulong)uVar19;
    }
    if ((this->super_ChIterativeSolverVI).record_violation_history != false) {
      ChIterativeSolverVI::AtIterationEnd(&this->super_ChIterativeSolverVI,dVar30,local_110,uVar15);
      dVar30 = this->maxviolation;
    }
    piVar1 = &(this->super_ChIterativeSolverVI).m_iterations;
    *piVar1 = *piVar1 + 1;
    uVar15 = uVar15 + 1;
  } while ((this->super_ChIterativeSolverVI).super_ChIterativeSolver.m_tolerance <= dVar30);
  return dVar30;
}

Assistant:

double ChSolverPSOR::Solve(ChSystemDescriptor& sysd) {
    std::vector<ChConstraint*>& mconstraints = sysd.GetConstraintsList();
    std::vector<ChVariables*>& mvariables = sysd.GetVariablesList();

    m_iterations = 0;
    maxviolation = 0;
    double maxdeltalambda = 0.;
    int i_friction_comp = 0;
    double old_lambda_friction[3];

    // 1)  Update auxiliary data in all constraints before starting,
    //     that is: g_i=[Cq_i]*[invM_i]*[Cq_i]' and  [Eq_i]=[invM_i]*[Cq_i]'
    for (unsigned int ic = 0; ic < mconstraints.size(); ic++)
        mconstraints[ic]->Update_auxiliary();

    // Average all g_i for the triplet of contact constraints n,u,v.
    //
    int j_friction_comp = 0;
    double gi_values[3];
    for (unsigned int ic = 0; ic < mconstraints.size(); ic++) {
        if (mconstraints[ic]->GetMode() == CONSTRAINT_FRIC) {
            gi_values[j_friction_comp] = mconstraints[ic]->Get_g_i();
            j_friction_comp++;
            if (j_friction_comp == 3) {
                double average_g_i = (gi_values[0] + gi_values[1] + gi_values[2]) / 3.0;
                mconstraints[ic - 2]->Set_g_i(average_g_i);
                mconstraints[ic - 1]->Set_g_i(average_g_i);
                mconstraints[ic - 0]->Set_g_i(average_g_i);
                j_friction_comp = 0;
            }
        }
    }

    // 2)  Compute, for all items with variables, the initial guess for
    //     still unconstrained system:

    for (unsigned int iv = 0; iv < mvariables.size(); iv++) {
        if (mvariables[iv]->IsActive())
            mvariables[iv]->Compute_invMb_v(mvariables[iv]->Get_qb(), mvariables[iv]->Get_fb());  // q = [M]'*fb
    }

    // 3)  For all items with variables, add the effect of initial (guessed)
    //     lagrangian reactions of constraints, if a warm start is desired.
    //     Otherwise, if no warm start, simply resets initial lagrangians to zero.
    if (m_warm_start) {
        for (unsigned int ic = 0; ic < mconstraints.size(); ic++)
            if (mconstraints[ic]->IsActive())
                mconstraints[ic]->Increment_q(mconstraints[ic]->Get_l_i());
    } else {
        for (unsigned int ic = 0; ic < mconstraints.size(); ic++)
            mconstraints[ic]->Set_l_i(0.);
    }

    // 4)  Perform the iteration loops
    //

    for (int iter = 0; iter < m_max_iterations; iter++) {
        // The iteration on all constraints
        //

        maxviolation = 0;
        maxdeltalambda = 0;
        i_friction_comp = 0;

        for (unsigned int ic = 0; ic < mconstraints.size(); ic++) {
            // skip computations if constraint not active.
            if (mconstraints[ic]->IsActive()) {
                // compute residual  c_i = [Cq_i]*q + b_i + cfm_i*l_i
                double mresidual = mconstraints[ic]->Compute_Cq_q() + mconstraints[ic]->Get_b_i() +
                                   mconstraints[ic]->Get_cfm_i() * mconstraints[ic]->Get_l_i();

                // true constraint violation may be different from 'mresidual' (ex:clamped if unilateral)
                double candidate_violation = fabs(mconstraints[ic]->Violation(mresidual));

                // compute:  delta_lambda = -(omega/g_i) * ([Cq_i]*q + b_i + cfm_i*l_i )
                double deltal = (m_omega / mconstraints[ic]->Get_g_i()) * (-mresidual);

                if (mconstraints[ic]->GetMode() == CONSTRAINT_FRIC) {
                    candidate_violation = 0;

                    // update:   lambda += delta_lambda;
                    old_lambda_friction[i_friction_comp] = mconstraints[ic]->Get_l_i();
                    mconstraints[ic]->Set_l_i(old_lambda_friction[i_friction_comp] + deltal);
                    i_friction_comp++;

                    if (i_friction_comp == 1)
                        candidate_violation = fabs(ChMin(0.0, mresidual));

                    if (i_friction_comp == 3) {
                        mconstraints[ic - 2]->Project();  // the N normal component will take care of N,U,V
                        double new_lambda_0 = mconstraints[ic - 2]->Get_l_i();
                        double new_lambda_1 = mconstraints[ic - 1]->Get_l_i();
                        double new_lambda_2 = mconstraints[ic - 0]->Get_l_i();
                        // Apply the smoothing: lambda= sharpness*lambda_new_projected + (1-sharpness)*lambda_old
                        if (m_shlambda != 1.0) {
                            new_lambda_0 = m_shlambda * new_lambda_0 + (1.0 - m_shlambda) * old_lambda_friction[0];
                            new_lambda_1 = m_shlambda * new_lambda_1 + (1.0 - m_shlambda) * old_lambda_friction[1];
                            new_lambda_2 = m_shlambda * new_lambda_2 + (1.0 - m_shlambda) * old_lambda_friction[2];
                            mconstraints[ic - 2]->Set_l_i(new_lambda_0);
                            mconstraints[ic - 1]->Set_l_i(new_lambda_1);
                            mconstraints[ic - 0]->Set_l_i(new_lambda_2);
                        }
                        double true_delta_0 = new_lambda_0 - old_lambda_friction[0];
                        double true_delta_1 = new_lambda_1 - old_lambda_friction[1];
                        double true_delta_2 = new_lambda_2 - old_lambda_friction[2];
                        mconstraints[ic - 2]->Increment_q(true_delta_0);
                        mconstraints[ic - 1]->Increment_q(true_delta_1);
                        mconstraints[ic - 0]->Increment_q(true_delta_2);

                        if (this->record_violation_history) {
                            maxdeltalambda = ChMax(maxdeltalambda, fabs(true_delta_0));
                            maxdeltalambda = ChMax(maxdeltalambda, fabs(true_delta_1));
                            maxdeltalambda = ChMax(maxdeltalambda, fabs(true_delta_2));
                        }
                        i_friction_comp = 0;
                    }
                } else {
                    // update:   lambda += delta_lambda;
                    double old_lambda = mconstraints[ic]->Get_l_i();
                    mconstraints[ic]->Set_l_i(old_lambda + deltal);

                    // If new lagrangian multiplier does not satisfy inequalities, project
                    // it into an admissible orthant (or, in general, onto an admissible set)
                    mconstraints[ic]->Project();

                    // After projection, the lambda may have changed a bit..
                    double new_lambda = mconstraints[ic]->Get_l_i();

                    // Apply the smoothing: lambda= sharpness*lambda_new_projected + (1-sharpness)*lambda_old
                    if (m_shlambda != 1.0) {
                        new_lambda = m_shlambda * new_lambda + (1.0 - m_shlambda) * old_lambda;
                        mconstraints[ic]->Set_l_i(new_lambda);
                    }

                    double true_delta = new_lambda - old_lambda;

                    // For all items with variables, add the effect of incremented
                    // (and projected) lagrangian reactions:
                    mconstraints[ic]->Increment_q(true_delta);

                    if (this->record_violation_history)
                        maxdeltalambda = ChMax(maxdeltalambda, fabs(true_delta));
                }

                maxviolation = ChMax(maxviolation, fabs(candidate_violation));

            }  // end IsActive()

        }  // end loop on constraints

        // For recording into violation history, if debugging
        if (this->record_violation_history)
            AtIterationEnd(maxviolation, maxdeltalambda, iter);

        m_iterations++;

        // Terminate the loop if violation in constraints has been successfully limited.
        if (maxviolation < m_tolerance)
            break;

    }  // end iteration loop

    return maxviolation;
}